

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkaccessmanager.cpp
# Opt level: O0

void QNetworkAccessManager::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QList<QString> *this;
  QMetaType QVar2;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  QNetworkAccessManager *_t;
  QStringList _r;
  QList<QString> *in_stack_ffffffffffffff08;
  QList<QSslError> *in_stack_ffffffffffffff18;
  QNetworkAccessManagerPrivate *in_stack_ffffffffffffff20;
  QNetworkAccessManager *in_stack_ffffffffffffff28;
  QMetaType local_60;
  QMetaTypeInterface *local_58;
  QMetaType local_50;
  QMetaTypeInterface *local_48;
  QMetaType local_40;
  QMetaTypeInterface *local_38;
  QMetaType local_30;
  QMetaType local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    this = (QList<QString> *)(ulong)in_EDX;
    switch(this) {
    case (QList<QString> *)0x0:
      proxyAuthenticationRequired
                ((QNetworkAccessManager *)this,(QNetworkProxy *)in_stack_ffffffffffffff08,
                 (QAuthenticator *)in_stack_ffffffffffffff18);
      break;
    case (QList<QString> *)0x1:
      authenticationRequired
                ((QNetworkAccessManager *)in_stack_ffffffffffffff08,
                 (QNetworkReply *)in_stack_ffffffffffffff18,(QAuthenticator *)this);
      break;
    case (QList<QString> *)0x2:
      finished((QNetworkAccessManager *)0x19f91f,(QNetworkReply *)in_stack_ffffffffffffff08);
      break;
    case (QList<QString> *)0x3:
      encrypted((QNetworkAccessManager *)0x19f93a,(QNetworkReply *)in_stack_ffffffffffffff08);
      break;
    case (QList<QString> *)0x4:
      sslErrors((QNetworkAccessManager *)this,(QNetworkReply *)in_stack_ffffffffffffff18,
                (QList<QSslError> *)in_stack_ffffffffffffff08);
      break;
    case (QList<QString> *)0x5:
      preSharedKeyAuthenticationRequired
                ((QNetworkAccessManager *)in_stack_ffffffffffffff08,
                 (QNetworkReply *)in_stack_ffffffffffffff18,(QSslPreSharedKeyAuthenticator *)this);
      break;
    case (QList<QString> *)0x6:
      local_20 = 0xaaaaaaaaaaaaaaaa;
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      supportedSchemesImplementation(in_stack_ffffffffffffff28);
      if (*(long *)in_RCX != 0) {
        QList<QString>::operator=(this,in_stack_ffffffffffffff08);
      }
      QList<QString>::~QList((QList<QString> *)0x19f9f6);
      break;
    case (QList<QString> *)0x7:
      d_func((QNetworkAccessManager *)0x19fa02);
      QNetworkAccessManagerPrivate::_q_replySslErrors
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      break;
    case (QList<QString> *)0x8:
      d_func((QNetworkAccessManager *)0x19fa1f);
      QNetworkAccessManagerPrivate::_q_replyPreSharedKeyAuthenticationRequired
                (in_stack_ffffffffffffff20,
                 (QSslPreSharedKeyAuthenticator *)in_stack_ffffffffffffff18);
    }
  }
  if (in_ESI == 7) {
    switch(in_EDX) {
    case 4:
      if (**(int **)(in_RCX + 8) == 1) {
        local_38 = (QMetaTypeInterface *)QMetaType::fromType<QList<QSslError>>();
        **(undefined8 **)in_RCX = local_38;
      }
      else {
        memset(&local_30,0,8);
        QMetaType::QMetaType(&local_30);
        **(undefined8 **)in_RCX = local_30.d_ptr;
      }
      break;
    case 5:
      if (**(int **)(in_RCX + 8) == 1) {
        local_48 = (QMetaTypeInterface *)QMetaType::fromType<QSslPreSharedKeyAuthenticator*>();
        **(undefined8 **)in_RCX = local_48;
      }
      else {
        memset(&local_40,0,8);
        QMetaType::QMetaType(&local_40);
        **(undefined8 **)in_RCX = local_40.d_ptr;
      }
      break;
    default:
      memset(&local_28,0,8);
      QMetaType::QMetaType(&local_28);
      **(undefined8 **)in_RCX = local_28.d_ptr;
      break;
    case 7:
      if (**(int **)(in_RCX + 8) == 0) {
        local_58 = (QMetaTypeInterface *)QMetaType::fromType<QList<QSslError>>();
        **(undefined8 **)in_RCX = local_58;
      }
      else {
        memset(&local_50,0,8);
        QMetaType::QMetaType(&local_50);
        **(undefined8 **)in_RCX = local_50.d_ptr;
      }
      break;
    case 8:
      if (**(int **)(in_RCX + 8) == 0) {
        QVar2 = QMetaType::fromType<QSslPreSharedKeyAuthenticator*>();
        **(undefined8 **)in_RCX = QVar2.d_ptr;
      }
      else {
        memset(&local_60,0,8);
        QMetaType::QMetaType(&local_60);
        **(undefined8 **)in_RCX = local_60.d_ptr;
      }
    }
  }
  if ((((in_ESI == 5) &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QNetworkAccessManager::*)(QNetworkProxy_const&,QAuthenticator*)>
                          (in_RCX,(void **)proxyAuthenticationRequired,0,0), !bVar1)) &&
      (bVar1 = QtMocHelpers::
               indexOfMethod<void(QNetworkAccessManager::*)(QNetworkReply*,QAuthenticator*)>
                         (in_RCX,(void **)authenticationRequired,0,1), !bVar1)) &&
     (((bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkAccessManager::*)(QNetworkReply*)>
                          (in_RCX,(void **)finished,0,2), !bVar1 &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkAccessManager::*)(QNetworkReply*)>
                          (in_RCX,(void **)encrypted,0,3), !bVar1)) &&
      (bVar1 = QtMocHelpers::
               indexOfMethod<void(QNetworkAccessManager::*)(QNetworkReply*,QList<QSslError>const&)>
                         (in_RCX,(void **)sslErrors,0,4), !bVar1)))) {
    QtMocHelpers::
    indexOfMethod<void(QNetworkAccessManager::*)(QNetworkReply*,QSslPreSharedKeyAuthenticator*)>
              (in_RCX,(void **)preSharedKeyAuthenticationRequired,0,5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessManager::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkAccessManager *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 1: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 2: _t->finished((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1]))); break;
        case 3: _t->encrypted((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1]))); break;
        case 4: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[2]))); break;
        case 5: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[2]))); break;
        case 6: { QStringList _r = _t->supportedSchemesImplementation();
            if (_a[0]) *reinterpret_cast< QStringList*>(_a[0]) = std::move(_r); }  break;
        case 7: _t->d_func()->_q_replySslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 8: _t->d_func()->_q_replyPreSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(const QNetworkProxy & , QAuthenticator * )>(_a, &QNetworkAccessManager::proxyAuthenticationRequired, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * , QAuthenticator * )>(_a, &QNetworkAccessManager::authenticationRequired, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * )>(_a, &QNetworkAccessManager::finished, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * )>(_a, &QNetworkAccessManager::encrypted, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * , const QList<QSslError> & )>(_a, &QNetworkAccessManager::sslErrors, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * , QSslPreSharedKeyAuthenticator * )>(_a, &QNetworkAccessManager::preSharedKeyAuthenticationRequired, 5))
            return;
    }
}